

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

CTcPrsNode * __thiscall CTcPrsOpBinGroupCompare::parse(CTcPrsOpBinGroupCompare *this)

{
  short *psVar1;
  int iVar2;
  tc_toktyp_t tVar3;
  undefined4 extraout_var;
  CTPNArglist *pCVar4;
  CTcPrsNode *pCVar5;
  CTcTokenizer *pCVar6;
  CTcPrsNode *lhs;
  CTcPrsNodeBase local_40;
  _func_int **local_38;
  
  iVar2 = (**((this->super_CTcPrsOpBinGroup).left_)->_vptr_CTcPrsOp)();
  if ((CTcPrsNode *)CONCAT44(extraout_var,iVar2) == (CTcPrsNode *)0x0) {
    return (CTcPrsNode *)0x0;
  }
  local_38 = (_func_int **)&PTR_gen_code_00361690;
  local_40._vptr_CTcPrsNodeBase = (_func_int **)CONCAT44(extraout_var,iVar2);
LAB_002309f9:
  do {
    do {
      iVar2 = CTcPrsOpBinGroup::find_and_apply_op
                        (&this->super_CTcPrsOpBinGroup,(CTcPrsNode **)&local_40);
    } while (iVar2 != 0);
    if ((((G_tok->curtok_).typ_ == TOKT_SYM) && ((G_tok->curtok_).text_len_ == 2)) &&
       (*(short *)(G_tok->curtok_).text_ == 0x7369)) {
      pCVar6 = G_tok;
      tVar3 = CTcTokenizer::next(G_tok);
      if (((tVar3 == TOKT_SYM) && ((G_tok->curtok_).text_len_ == 2)) &&
         (*(short *)(G_tok->curtok_).text_ == 0x6e69)) {
        pCVar4 = parse_inlist((CTcPrsOpBinGroupCompare *)pCVar6);
        if (pCVar4 == (CTPNArglist *)0x0) {
          return (CTcPrsNode *)0x0;
        }
        pCVar5 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,0x20);
        pCVar5[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = local_40._vptr_CTcPrsNodeBase;
        pCVar5[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)pCVar4;
        *(byte *)&pCVar5[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
             *(byte *)&pCVar5[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase & 0xfe;
        (pCVar5->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = local_38;
        local_40._vptr_CTcPrsNodeBase = (_func_int **)pCVar5;
        goto LAB_002309f9;
      }
      CTcTokenizer::unget(G_tok);
    }
    if ((G_tok->curtok_).typ_ != TOKT_SYM) {
      return (CTcPrsNode *)local_40._vptr_CTcPrsNodeBase;
    }
    if ((G_tok->curtok_).text_len_ != 3) {
      return (CTcPrsNode *)local_40._vptr_CTcPrsNodeBase;
    }
    psVar1 = (short *)(G_tok->curtok_).text_;
    if ((char)psVar1[1] != 't' || *psVar1 != 0x6f6e) {
      return (CTcPrsNode *)local_40._vptr_CTcPrsNodeBase;
    }
    pCVar6 = G_tok;
    tVar3 = CTcTokenizer::next(G_tok);
    if (((tVar3 != TOKT_SYM) || ((G_tok->curtok_).text_len_ != 2)) ||
       (*(short *)(G_tok->curtok_).text_ != 0x6e69)) {
      CTcTokenizer::unget(G_tok);
      return (CTcPrsNode *)local_40._vptr_CTcPrsNodeBase;
    }
    pCVar4 = parse_inlist((CTcPrsOpBinGroupCompare *)pCVar6);
    if (pCVar4 == (CTPNArglist *)0x0) {
      return (CTcPrsNode *)0x0;
    }
    pCVar5 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,0x20);
    pCVar5[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = local_40._vptr_CTcPrsNodeBase;
    pCVar5[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)pCVar4;
    *(byte *)&pCVar5[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
         *(byte *)&pCVar5[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase & 0xfe;
    (pCVar5->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_00361798;
    local_40._vptr_CTcPrsNodeBase = (_func_int **)pCVar5;
  } while( true );
}

Assistant:

CTcPrsNode *CTcPrsOpBinGroupCompare::parse() const
{
    /* parse our left side - if that fails, return failure */
    CTcPrsNode *lhs = left_->parse();
    if (lhs == 0)
        return 0;

    /* keep going as long as we find one of our operators */
    for (;;)
    {
        /* 
         *   try one of our regular operators - if we find it, go back for
         *   another round to see if there's another operator following
         *   the next expression
         */
        if (find_and_apply_op(&lhs))
            continue;

        /* 
         *   check for the 'is in' operator - 'is' and 'in' aren't
         *   keywords, so we must check for symbol tokens with the text of
         *   these context-sensitive keywords 
         */
        if (G_tok->cur() == TOKT_SYM
            && G_tok->getcur()->text_matches("is", 2))
        {
            /* we have 'is' - get the next token and check if it's 'in' */
            if (G_tok->next() == TOKT_SYM
                && G_tok->getcur()->text_matches("in", 2))
            {
                /* scan the expression list */
                CTPNArglist *rhs = parse_inlist();
                if (rhs == 0)
                    return 0;

                /* build the node */
                lhs = new CTPNIsIn(lhs, rhs);

                /* 
                 *   we've applied the 'is in' operator - go back for
                 *   another operator from the comparison group 
                 */
                continue;
            }
            else
            {
                /* it's not 'is in' - throw back the token and keep looking */
                G_tok->unget();
            }
        }

        /*
         *   Check for the 'not in' operator 
         */
        if (G_tok->cur() == TOKT_SYM
            && G_tok->getcur()->text_matches("not", 3))
        {
            /* we have 'is' - get the next token and check if it's 'in' */
            if (G_tok->next() == TOKT_SYM
                && G_tok->getcur()->text_matches("in", 2))
            {
                /* scan the expression list */
                CTPNArglist *rhs = parse_inlist();
                if (rhs == 0)
                    return 0;

                /* build the node */
                lhs = new CTPNNotIn(lhs, rhs);

                /* 
                 *   we've applied the 'is in' operator - go back for
                 *   another operator from the comparison group 
                 */
                continue;
            }
            else
            {
                /* it's not 'is in' - throw back the token and keep looking */
                G_tok->unget();
            }
        }

        /* we didn't find any of our operators - we're done */
        break;
    }

    /* return the expression */
    return lhs;
}